

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

Node * __thiscall czh::node::Node::operator=(Node *this,Node *v)

{
  bool bVar1;
  NodeData *pNVar2;
  Value *pVVar3;
  Value local_110;
  reference local_e8;
  Node *r;
  iterator __end3;
  iterator __begin3;
  list<czh::node::Node,_std::allocator<czh::node::Node>_> *__range3;
  NodeData *nd;
  NodeData local_b0;
  Token local_68;
  Node *local_18;
  Node *v_local;
  Node *this_local;
  
  local_18 = v;
  v_local = this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->name,&v->name);
  this->last_node = local_18->last_node;
  czh::token::Token::Token(&local_68,&local_18->czh_token);
  czh::token::Token::operator=(&this->czh_token,&local_68);
  czh::token::Token::~Token(&local_68);
  bVar1 = is_node(local_18);
  if (bVar1) {
    pNVar2 = std::get<czh::node::Node::NodeData,czh::node::Node::NodeData,czh::value::Value>
                       (&local_18->data);
    NodeData::NodeData(&local_b0,pNVar2);
    std::variant<czh::node::Node::NodeData,czh::value::Value>::
    emplace<czh::node::Node::NodeData,czh::node::Node::NodeData>
              ((variant<czh::node::Node::NodeData,czh::value::Value> *)&this->data,&local_b0);
    NodeData::~NodeData(&local_b0);
    pNVar2 = std::get<czh::node::Node::NodeData,czh::node::Node::NodeData,czh::value::Value>
                       (&this->data);
    __end3 = std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::begin
                       (&pNVar2->nodes);
    r = (Node *)std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::end
                          (&pNVar2->nodes);
    while (bVar1 = std::operator==(&__end3,(_Self *)&r), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_e8 = std::_List_iterator<czh::node::Node>::operator*(&__end3);
      local_e8->last_node = this;
      std::_List_iterator<czh::node::Node>::operator++(&__end3);
    }
  }
  else {
    pVVar3 = std::get<czh::value::Value,czh::node::Node::NodeData,czh::value::Value>
                       (&local_18->data);
    czh::value::Value::Value(&local_110,pVVar3);
    std::variant<czh::node::Node::NodeData,czh::value::Value>::operator=
              ((variant<czh::node::Node::NodeData,czh::value::Value> *)&this->data,&local_110);
    czh::value::Value::~Value(&local_110);
  }
  return this;
}

Assistant:

Node &operator=(const Node &v)
    {
      name = v.name;
      last_node = v.last_node;
      czh_token = token::Token(v.czh_token);
      if (v.is_node())
      {
        data.emplace<NodeData>(NodeData(std::get<NodeData>(v.data)));
        auto &nd = std::get<NodeData>(data);
        for (auto &r: nd.nodes)
        {
          r.last_node = this;
        }
      }
      else
      {
        data = Value(std::get<Value>(v.data));
      }
      return *this;
    }